

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O2

void __thiscall
UtilityTest_Unpack8Test_Test::~UtilityTest_Unpack8Test_Test(UtilityTest_Unpack8Test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UtilityTest, Unpack8Test) {
    // Test case 1: Unpacking a single byte
    uint8_t data1[] = {0xAB};
    uint8_t result1 = Unpack8(data1, 0);
    EXPECT_EQ(result1, 0xAB);

    // Test case 2: Unpacking a byte at a non-zero offset
    uint8_t data2[] = {0x12, 0x34, 0x56};
    uint8_t result2 = Unpack8(data2, 1);
    EXPECT_EQ(result2, 0x34);

    // Test case 3: Unpacking a byte from a larger array
    uint8_t data3[] = {0x11, 0x22, 0x33, 0x44, 0x55};
    uint8_t result3 = Unpack8(data3, 3);
    EXPECT_EQ(result3, 0x44);
}